

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode SUNLinSolSetScalingVectors_SPBCGS(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  SUNContext_conflict sunctx_local_scope_;
  N_Vector s2_local;
  N_Vector s1_local;
  SUNLinearSolver S_local;
  
  *(N_Vector *)((long)S->content + 0x48) = s1;
  *(N_Vector *)((long)S->content + 0x50) = s2;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetScalingVectors_SPBCGS(SUNLinearSolver S, N_Vector s1,
                                             N_Vector s2)
{
  SUNFunctionBegin(S->sunctx);
  /* set N_Vector pointers to integrator-supplied scaling vectors,
     and return with success */
  SPBCGS_CONTENT(S)->s1 = s1;
  SPBCGS_CONTENT(S)->s2 = s2;
  return SUN_SUCCESS;
}